

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::ir::copyWithReplacedDest
          (ir *this,shared_ptr<mocker::ir::IRInst> *inst,shared_ptr<mocker::ir::Reg> *newDest)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  shared_ptr<mocker::ir::Addr> *arg;
  pointer __args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<mocker::ir::IRInst> sVar8;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  args;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  options;
  undefined1 local_a1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> local_98;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_70;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  local_58;
  shared_ptr<mocker::ir::Reg> *local_40;
  element_type *local_38;
  
  getOperandsUsed(&local_70,inst);
  peVar2 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  switch(peVar2->type) {
  case Deleted:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("operands.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x4d,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    puVar4 = (undefined8 *)operator_new(0x20);
    puVar4[1] = 0x100000001;
    *puVar4 = &PTR___Sp_counted_ptr_inplace_00124bf8;
    *(undefined4 *)(puVar4 + 3) = 0;
    puVar4[2] = &PTR__IRInst_00124c48;
    *(undefined8 **)this = puVar4 + 2;
    *(undefined8 **)(this + 8) = puVar4;
    goto LAB_00112b30;
  case Comment:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("operands.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x51,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Comment,std::allocator<mocker::ir::Comment>,std::__cxx11::string_const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Comment **)&local_98,(allocator<mocker::ir::Comment> *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(peVar2 + 1));
    break;
  case AttachedComment:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("operands.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x55,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::AttachedComment,std::allocator<mocker::ir::AttachedComment>,std::__cxx11::string_const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(AttachedComment **)&local_98,
               (allocator<mocker::ir::AttachedComment> *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(peVar2 + 1));
    break;
  case Assign:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("operands.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x62,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Assign,std::allocator<mocker::ir::Assign>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Assign **)&local_98,(allocator<mocker::ir::Assign> *)&local_58,newDest,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    break;
  case ArithUnaryInst:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("operands.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x66,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_58.
    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,peVar2[2].type);
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::ArithUnaryInst,std::allocator<mocker::ir::ArithUnaryInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ArithUnaryInst **)&local_98,
               (allocator<mocker::ir::ArithUnaryInst> *)&local_a1,newDest,(OpType *)&local_58,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    break;
  case ArithBinaryInst:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      __assert_fail("operands.size() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x6a,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_58.
    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,peVar2[2].type);
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ArithBinaryInst **)&local_98,
               (allocator<mocker::ir::ArithBinaryInst> *)&local_a1,newDest,(OpType *)&local_58,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    break;
  case RelationInst:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      __assert_fail("operands.size() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x6e,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_58.
    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,peVar2[2].type);
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::RelationInst,std::allocator<mocker::ir::RelationInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::RelationInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(RelationInst **)&local_98,
               (allocator<mocker::ir::RelationInst> *)&local_a1,newDest,(OpType *)&local_58,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    break;
  case Store:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      __assert_fail("operands.size() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x72,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Store **)&local_98,(allocator<mocker::ir::Store> *)&local_58,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    break;
  case Load:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("operands.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x76,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Load **)&local_98,(allocator<mocker::ir::Load> *)&local_58,newDest,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    break;
  case Alloca:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("operands.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x59,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Alloca **)&local_98,(allocator<mocker::ir::Alloca> *)&local_58,newDest)
    ;
    break;
  case Malloc:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("operands.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x7a,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Malloc,std::allocator<mocker::ir::Malloc>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Malloc **)&local_98,(allocator<mocker::ir::Malloc> *)&local_58,newDest,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    break;
  case Branch:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("operands.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x7e,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>const&,std::shared_ptr<mocker::ir::Label>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Branch **)&local_98,(allocator<mocker::ir::Branch> *)&local_58,
               local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (shared_ptr<mocker::ir::Label> *)&peVar2[2].type,
               (shared_ptr<mocker::ir::Label> *)&peVar2[3].type);
    break;
  case Jump:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("operands.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x5d,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>const&>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Jump **)&local_98,(allocator<mocker::ir::Jump> *)&local_58,
               (shared_ptr<mocker::ir::Label> *)&peVar2[1].type);
    break;
  case Ret:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if (0x10 < (ulong)((long)local_70.
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_70.
                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      __assert_fail("operands.size() <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x82,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_58.
      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    else {
      local_58.
      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((local_70.
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58.
      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((local_70.
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                    _M_pi;
      if (local_58.
          super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &((local_58.
                      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->first).
                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = &((local_58.
                      super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->first).
                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Ret,std::allocator<mocker::ir::Ret>,std::shared_ptr<mocker::ir::Addr>const>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Ret **)&local_98,(allocator<mocker::ir::Ret> *)&local_a1,
               (shared_ptr<mocker::ir::Addr> *)&local_58);
    _Var3._M_pi = local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this =
         local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if (local_58.
        super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_58.
                 super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    goto LAB_00112b23;
  case Call:
    p_Var6 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)peVar2[5]._vptr_IRInst - *(long *)&peVar2[4].type) {
      local_40 = newDest;
      __assert_fail("operands.size() == p->getArgs().size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x87,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98.second.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_40 = newDest;
    std::
    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
    reserve((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
             *)&local_98,
            (long)local_70.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_70.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __args = local_70.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>
        ::emplace_back<std::shared_ptr<mocker::ir::Addr>const&>
                  ((vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>
                    *)&local_98,__args);
        __args = __args + 1;
      } while (__args != local_70.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_58.
    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Call,std::allocator<mocker::ir::Call>,std::shared_ptr<mocker::ir::Reg>const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_58.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(Call **)&local_58,
               (allocator<mocker::ir::Call> *)&local_a1,local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&peVar2[2].type,
               (vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                *)&local_98);
    *(pointer *)this =
         local_58.
         super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 8) =
         local_58.
         super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
    ~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
             *)&local_98);
    goto joined_r0x00112876;
  case Phi:
    local_a0 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
      }
    }
    local_38 = (element_type *)this;
    if ((long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4 !=
        (long)peVar2[3]._vptr_IRInst - *(long *)&peVar2[2].type >> 5) {
      local_40 = newDest;
      __assert_fail("operands.size() == p->getOptions().size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x8f,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    local_58.
    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = newDest;
    if (local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_70.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar5 = 0;
      uVar7 = 0;
      do {
        local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)&((local_70.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
              lVar5);
        p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&((local_70.
                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi + lVar5);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_98.second.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(*(long *)&peVar2[2].type + 0x10 + lVar5 * 2);
        if ((local_98.second.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr == (element_type *)0x0) ||
           (this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       (*(long *)&peVar2[2].type + 0x18 + lVar5 * 2),
           this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var6;
        local_98.second.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = this_00;
        std::
        vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
        ::
        emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>
                  ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                    *)&local_58,&local_98);
        if (local_98.second.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.second.
                     super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if (local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar7 < (ulong)((long)local_70.
                                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_70.
                                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Phi,std::allocator<mocker::ir::Phi>,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>>
              (&local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Phi **)&local_98,(allocator<mocker::ir::Phi> *)&local_a1,local_40,
               &local_58);
    this = (ir *)local_38;
    local_38->_vptr_IRInst =
         (_func_int **)
         local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_38->type =
         local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    std::
    vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
    ::~vector(&local_58);
    p_Var6 = local_a0;
joined_r0x00112876:
    if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00112b30;
    goto LAB_00112b2b;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                  ,0x98,
                  "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                 );
  }
  *(element_type **)this =
       local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
       local_98.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
LAB_00112b23:
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00112b2b:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
LAB_00112b30:
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  ~vector(&local_70);
  sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IRInst>
copyWithReplacedDest(const std::shared_ptr<ir::IRInst> &inst,
                     const std::shared_ptr<ir::Reg> &newDest) {
  return copyWithReplacedDestAndOperands(inst, newDest, getOperandsUsed(inst));
}